

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

Vec_Wrd_t * Vec_WrdStart(int nSize)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *__s;
  
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar1 << 3);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = nSize;
  memset(__s,0,(long)nSize << 3);
  return pVVar2;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdStart( int nSize )
{
    Vec_Wrd_t * p;
    p = Vec_WrdAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(word) * nSize );
    return p;
}